

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O1

void xmlSAX2Text(xmlParserCtxtPtr ctxt,xmlChar *ch,int len,xmlElementType type)

{
  int iVar1;
  _xmlNode *p_Var2;
  int iVar3;
  xmlChar *pxVar4;
  xmlNodePtr pxVar5;
  long lVar6;
  char *msg;
  bool bVar7;
  
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (ctxt->node != (xmlNodePtr)0x0)) {
    pxVar5 = ctxt->node->last;
    if (pxVar5 == (xmlNodePtr)0x0) {
      if (type == XML_TEXT_NODE) {
        pxVar5 = xmlSAX2TextNode(ctxt,ch,len);
      }
      else {
        pxVar5 = xmlNewCDataBlock(ctxt->myDoc,ch,len);
      }
      if (pxVar5 == (xmlNodePtr)0x0) {
        msg = "xmlSAX2Characters";
LAB_0017db6f:
        xmlSAX2ErrMemory(ctxt,msg);
        return;
      }
      p_Var2 = ctxt->node;
      p_Var2->children = pxVar5;
      p_Var2->last = pxVar5;
      pxVar5->parent = p_Var2;
      pxVar5->doc = p_Var2->doc;
    }
    else {
      if (pxVar5->type == type) {
        bVar7 = true;
        if (type == XML_TEXT_NODE) {
          bVar7 = pxVar5->name == "text";
        }
      }
      else {
        bVar7 = false;
      }
      if (bVar7) {
        if (ctxt->nodemem != 0) {
          pxVar4 = pxVar5->content;
          if ((_xmlAttr **)pxVar4 == &pxVar5->properties) {
            pxVar4 = xmlStrdup(pxVar4);
            pxVar5->content = pxVar4;
            pxVar5->properties = (_xmlAttr *)0x0;
          }
          else if ((ctxt->nodemem == ctxt->nodelen + 1) &&
                  (iVar3 = xmlDictOwns(ctxt->dict,pxVar4), iVar3 != 0)) {
            pxVar4 = xmlStrdup(pxVar5->content);
            pxVar5->content = pxVar4;
          }
          if (pxVar5->content == (xmlChar *)0x0) {
            msg = "xmlSAX2Characters: xmlStrdup returned NULL";
          }
          else if ((int)(len ^ 0x7fffffffU) < ctxt->nodelen) {
            msg = "xmlSAX2Characters overflow prevented";
          }
          else {
            iVar3 = ctxt->nodelen + len;
            if ((iVar3 < 0x989681) || ((ctxt->options & 0x80000) != 0)) {
              iVar1 = ctxt->nodemem;
              if (iVar1 <= iVar3) {
                iVar3 = iVar1 + len;
                if ((int)(len ^ 0x7fffffffU) < iVar1) {
                  iVar3 = 0x7fffffff;
                }
                iVar1 = iVar3 * 2;
                if (0x3fffffff < iVar3) {
                  iVar1 = 0x7fffffff;
                }
                pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar5->content,(long)iVar1);
                if (pxVar4 == (xmlChar *)0x0) {
                  xmlSAX2ErrMemory(ctxt,"xmlSAX2Characters");
                  return;
                }
                ctxt->nodemem = iVar1;
                pxVar5->content = pxVar4;
              }
              memcpy(pxVar5->content + ctxt->nodelen,ch,(long)len);
              lVar6 = (long)ctxt->nodelen + (long)len;
              ctxt->nodelen = (int)lVar6;
              pxVar5->content[lVar6] = '\0';
              return;
            }
            msg = "xmlSAX2Characters: huge text node";
          }
          goto LAB_0017db6f;
        }
        if (bVar7) {
          iVar3 = xmlTextConcat(pxVar5,ch,len);
          if (iVar3 != 0) {
            xmlSAX2ErrMemory(ctxt,"xmlSAX2Characters");
          }
          if (ctxt->node->children == (_xmlNode *)0x0) {
            return;
          }
          iVar3 = xmlStrlen(pxVar5->content);
          ctxt->nodelen = iVar3;
          ctxt->nodemem = iVar3 + 1;
          return;
        }
      }
      if (type == XML_TEXT_NODE) {
        pxVar5 = xmlSAX2TextNode(ctxt,ch,len);
        pxVar5->doc = ctxt->myDoc;
      }
      else {
        pxVar5 = xmlNewCDataBlock(ctxt->myDoc,ch,len);
      }
      if (pxVar5 == (xmlNodePtr)0x0) {
        return;
      }
      xmlAddChild(ctxt->node,pxVar5);
      if (ctxt->node->children == (_xmlNode *)0x0) {
        return;
      }
    }
    ctxt->nodelen = len;
    ctxt->nodemem = len + 1;
  }
  return;
}

Assistant:

static void
xmlSAX2Text(xmlParserCtxtPtr ctxt, const xmlChar *ch, int len,
            xmlElementType type)
{
    xmlNodePtr lastChild;

    if (ctxt == NULL) return;
#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2Characters(%.30s, %d)\n", ch, len);
#endif
    /*
     * Handle the data if any. If there is no child
     * add it as content, otherwise if the last child is text,
     * concatenate it, else create a new node of type text.
     */

    if (ctxt->node == NULL) {
#ifdef DEBUG_SAX_TREE
	xmlGenericError(xmlGenericErrorContext,
		"add chars: ctxt->node == NULL !\n");
#endif
        return;
    }
    lastChild = ctxt->node->last;
#ifdef DEBUG_SAX_TREE
    xmlGenericError(xmlGenericErrorContext,
	    "add chars to %s \n", ctxt->node->name);
#endif

    /*
     * Here we needed an accelerator mechanism in case of very large
     * elements. Use an attribute in the structure !!!
     */
    if (lastChild == NULL) {
        if (type == XML_TEXT_NODE)
            lastChild = xmlSAX2TextNode(ctxt, ch, len);
        else
            lastChild = xmlNewCDataBlock(ctxt->myDoc, ch, len);
	if (lastChild != NULL) {
	    ctxt->node->children = lastChild;
	    ctxt->node->last = lastChild;
	    lastChild->parent = ctxt->node;
	    lastChild->doc = ctxt->node->doc;
	    ctxt->nodelen = len;
	    ctxt->nodemem = len + 1;
	} else {
	    xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters");
	    return;
	}
    } else {
	int coalesceText = (lastChild != NULL) &&
	    (lastChild->type == type) &&
	    ((type != XML_TEXT_NODE) ||
             (lastChild->name == xmlStringText));
	if ((coalesceText) && (ctxt->nodemem != 0)) {
	    /*
	     * The whole point of maintaining nodelen and nodemem,
	     * xmlTextConcat is too costly, i.e. compute length,
	     * reallocate a new buffer, move data, append ch. Here
	     * We try to minimize realloc() uses and avoid copying
	     * and recomputing length over and over.
	     */
	    if (lastChild->content == (xmlChar *)&(lastChild->properties)) {
		lastChild->content = xmlStrdup(lastChild->content);
		lastChild->properties = NULL;
	    } else if ((ctxt->nodemem == ctxt->nodelen + 1) &&
	               (xmlDictOwns(ctxt->dict, lastChild->content))) {
		lastChild->content = xmlStrdup(lastChild->content);
	    }
	    if (lastChild->content == NULL) {
		xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters: xmlStrdup returned NULL");
		return;
 	    }
	    if (ctxt->nodelen > INT_MAX - len) {
                xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters overflow prevented");
                return;
	    }
            if ((ctxt->nodelen + len > XML_MAX_TEXT_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters: huge text node");
                return;
            }
	    if (ctxt->nodelen + len >= ctxt->nodemem) {
		xmlChar *newbuf;
		int size;

		size = ctxt->nodemem > INT_MAX - len ?
                       INT_MAX :
                       ctxt->nodemem + len;
		size = size > INT_MAX / 2 ? INT_MAX : size * 2;
                newbuf = (xmlChar *) xmlRealloc(lastChild->content,size);
		if (newbuf == NULL) {
		    xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters");
		    return;
		}
		ctxt->nodemem = size;
		lastChild->content = newbuf;
	    }
	    memcpy(&lastChild->content[ctxt->nodelen], ch, len);
	    ctxt->nodelen += len;
	    lastChild->content[ctxt->nodelen] = 0;
	} else if (coalesceText) {
	    if (xmlTextConcat(lastChild, ch, len)) {
		xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters");
	    }
	    if (ctxt->node->children != NULL) {
		ctxt->nodelen = xmlStrlen(lastChild->content);
		ctxt->nodemem = ctxt->nodelen + 1;
	    }
	} else {
	    /* Mixed content, first time */
            if (type == XML_TEXT_NODE) {
                lastChild = xmlSAX2TextNode(ctxt, ch, len);
                lastChild->doc = ctxt->myDoc;
            } else
                lastChild = xmlNewCDataBlock(ctxt->myDoc, ch, len);
	    if (lastChild != NULL) {
		xmlAddChild(ctxt->node, lastChild);
		if (ctxt->node->children != NULL) {
		    ctxt->nodelen = len;
		    ctxt->nodemem = len + 1;
		}
	    }
	}
    }
}